

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_db_config(sqlite3 *db,int op,...)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vdbe *pVVar4;
  int in_ECX;
  long lVar5;
  void *in_RDX;
  va_list ap;
  char *local_a8;
  uint *local_a0;
  int local_98;
  
  if (op == 1000) {
    db->aDb->zDbSName = local_a8;
    return 0;
  }
  if (op == 0x3e9) {
    iVar2 = setupLookaside(db,in_RDX,in_ECX,local_98);
    return iVar2;
  }
  lVar5 = 0;
  while (sqlite3_db_config::aFlagOp[lVar5].op != op) {
    lVar5 = lVar5 + 1;
    if (lVar5 == 5) {
      return 1;
    }
  }
  local_a8._0_4_ = (int)in_RDX;
  uVar1 = db->flags;
  if ((int)local_a8 < 1) {
    if ((int)local_a8 != 0) goto LAB_0011a1c2;
    uVar3 = ~sqlite3_db_config::aFlagOp[lVar5].mask & uVar1;
  }
  else {
    uVar3 = sqlite3_db_config::aFlagOp[lVar5].mask | uVar1;
  }
  db->flags = uVar3;
  if (uVar1 != uVar3) {
    for (pVVar4 = db->pVdbe; pVVar4 != (Vdbe *)0x0; pVVar4 = pVVar4->pNext) {
      pVVar4->field_0xc0 = pVVar4->field_0xc0 | 1;
    }
  }
LAB_0011a1c2:
  if (local_a0 != (uint *)0x0) {
    *local_a0 = (uint)((db->flags & sqlite3_db_config::aFlagOp[lVar5].mask) != 0);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_db_config(sqlite3 *db, int op, ...){
  va_list ap;
  int rc;
  va_start(ap, op);
  switch( op ){
    case SQLITE_DBCONFIG_MAINDBNAME: {
      db->aDb[0].zDbSName = va_arg(ap,char*);
      rc = SQLITE_OK;
      break;
    }
    case SQLITE_DBCONFIG_LOOKASIDE: {
      void *pBuf = va_arg(ap, void*); /* IMP: R-26835-10964 */
      int sz = va_arg(ap, int);       /* IMP: R-47871-25994 */
      int cnt = va_arg(ap, int);      /* IMP: R-04460-53386 */
      rc = setupLookaside(db, pBuf, sz, cnt);
      break;
    }
    default: {
      static const struct {
        int op;      /* The opcode */
        u32 mask;    /* Mask of the bit in sqlite3.flags to set/clear */
      } aFlagOp[] = {
        { SQLITE_DBCONFIG_ENABLE_FKEY,           SQLITE_ForeignKeys    },
        { SQLITE_DBCONFIG_ENABLE_TRIGGER,        SQLITE_EnableTrigger  },
        { SQLITE_DBCONFIG_ENABLE_FTS3_TOKENIZER, SQLITE_Fts3Tokenizer  },
        { SQLITE_DBCONFIG_ENABLE_LOAD_EXTENSION, SQLITE_LoadExtension  },
        { SQLITE_DBCONFIG_NO_CKPT_ON_CLOSE,      SQLITE_NoCkptOnClose  },
      };
      unsigned int i;
      rc = SQLITE_ERROR; /* IMP: R-42790-23372 */
      for(i=0; i<ArraySize(aFlagOp); i++){
        if( aFlagOp[i].op==op ){
          int onoff = va_arg(ap, int);
          int *pRes = va_arg(ap, int*);
          int oldFlags = db->flags;
          if( onoff>0 ){
            db->flags |= aFlagOp[i].mask;
          }else if( onoff==0 ){
            db->flags &= ~aFlagOp[i].mask;
          }
          if( oldFlags!=db->flags ){
            sqlite3ExpirePreparedStatements(db);
          }
          if( pRes ){
            *pRes = (db->flags & aFlagOp[i].mask)!=0;
          }
          rc = SQLITE_OK;
          break;
        }
      }
      break;
    }
  }
  va_end(ap);
  return rc;
}